

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatementReader.cpp
# Opt level: O1

void __thiscall
Js::
StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
::Create(StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
         *this,FunctionBody *functionRead,uint startOffset,bool useOriginalByteCode)

{
  SmallSpanSequence *statementMap;
  Utf8SourceInfo *pUVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ByteBlock *this_00;
  byte *byteCodeStart;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *fullstatementMap;
  
  if (functionRead == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/StatementReader.cpp"
                                ,0x57,"(functionRead != nullptr)",
                                "Must provide valid function to execute");
    if (!bVar3) goto LAB_008b37c4;
    *puVar4 = 0;
  }
  if (useOriginalByteCode) {
    this_00 = FunctionBody::GetOriginalByteCode(functionRead);
  }
  else {
    this_00 = FunctionBody::GetByteCode(functionRead);
  }
  if (this_00 == (ByteBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/StatementReader.cpp"
                                ,0x5d,"(pblkByteCode != nullptr)",
                                "Must have valid byte-code to read");
    if (!bVar3) {
LAB_008b37c4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  statementMap = (functionRead->m_sourceInfo).pSpanSequence;
  if ((statementMap == (SmallSpanSequence *)0x0) &&
     (((pUVar1 = (functionRead->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.
                 ptr, (pUVar1->debugModeSource).ptr != (uchar *)0x0 ||
       ((pUVar1->field_0xa8 & 0x20) != 0)) && ((pUVar1->field_0xa8 & 0x40) != 0)))) {
    fullstatementMap =
         (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)functionRead,StatementMaps);
  }
  else {
    fullstatementMap =
         (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
  }
  byteCodeStart = ByteBlock::GetBuffer(this_00);
  Create(this,byteCodeStart,startOffset,statementMap,fullstatementMap);
  return;
}

Assistant:

void StatementReader<FunctionBody::StatementMapList>::Create(FunctionBody* functionRead, uint startOffset, bool useOriginalByteCode)
    {
        AssertMsg(functionRead != nullptr, "Must provide valid function to execute");

        ByteBlock * pblkByteCode = useOriginalByteCode ?
            functionRead->GetOriginalByteCode() :
            functionRead->GetByteCode();

        AssertMsg(pblkByteCode != nullptr, "Must have valid byte-code to read");

        SmallSpanSequence* statementMap = functionRead->GetStatementMapSpanSequence();
        FunctionBody::StatementMapList* fullMap = nullptr;
        if (statementMap == nullptr && functionRead->IsInDebugMode())
        {
            fullMap = functionRead->GetStatementMaps();
        }
        Create(pblkByteCode->GetBuffer(), startOffset, statementMap, fullMap);
    }